

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraCodeBlocksGenerator::CreateDummyTargetFile_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeBlocksGenerator *this,cmLocalGenerator *lg,
          cmTarget *target)

{
  bool bVar1;
  char *pcVar2;
  string *psVar3;
  ostream *poVar4;
  undefined1 local_2b0 [8];
  cmGeneratedFileStream fout;
  allocator local_32;
  byte local_31;
  cmMakefile *local_30;
  cmMakefile *mf;
  cmTarget *target_local;
  cmLocalGenerator *lg_local;
  cmExtraCodeBlocksGenerator *this_local;
  string *filename;
  
  mf = (cmMakefile *)target;
  target_local = (cmTarget *)lg;
  lg_local = (cmLocalGenerator *)this;
  this_local = (cmExtraCodeBlocksGenerator *)__return_storage_ptr__;
  local_30 = cmLocalGenerator::GetMakefile(lg);
  local_31 = 0;
  pcVar2 = cmMakefile::GetCurrentBinaryDirectory(local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_32);
  std::allocator<char>::~allocator((allocator<char> *)&local_32);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  (**(code **)(*(long *)&(target_local->Properties).
                         super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                         ._M_t._M_impl + 0x60))(&fout.field_0x240,target_local,mf);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&fout.field_0x240);
  std::__cxx11::string::~string((string *)&fout.field_0x240);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  psVar3 = cmTarget::GetName_abi_cxx11_((cmTarget *)mf);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar3);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".objlib");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_2b0,pcVar2,false);
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)(local_2b0 + (long)*(_func_int **)((long)local_2b0 + -0x18)));
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)local_2b0,"# This is a dummy file for the OBJECT library ");
    psVar3 = cmTarget::GetName_abi_cxx11_((cmTarget *)mf);
    poVar4 = std::operator<<(poVar4,(string *)psVar3);
    poVar4 = std::operator<<(poVar4," for the CMake CodeBlocks project generator.\n");
    std::operator<<(poVar4,"# Don\'t edit, this file will be overwritten.\n");
  }
  local_31 = 1;
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2b0);
  if ((local_31 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeBlocksGenerator::CreateDummyTargetFile(
                                        cmLocalGenerator* lg,
                                        cmTarget* target) const
{
  cmMakefile *mf = lg->GetMakefile();
  // this file doesn't seem to be used by C::B in custom makefile mode,
  // but we generate a unique file for each OBJECT library so in case
  // C::B uses it in some way, the targets don't interfere with each other.
  std::string filename = mf->GetCurrentBinaryDirectory();
  filename += "/";
  filename += lg->GetTargetDirectory(*target);
  filename += "/";
  filename += target->GetName();
  filename += ".objlib";
  cmGeneratedFileStream fout(filename.c_str());
  if(fout)
    {
    fout << "# This is a dummy file for the OBJECT library "
         << target->GetName()
         << " for the CMake CodeBlocks project generator.\n"
         << "# Don't edit, this file will be overwritten.\n";
    }
  return filename;
}